

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

Parser * __thiscall
Catch::Clara::Parser::operator|(Parser *__return_storage_ptr__,Parser *this,ExeName *other)

{
  Parser *pPVar1;
  Parser local_80;
  ExeName *local_20;
  ExeName *other_local;
  Parser *this_local;
  
  local_20 = other;
  other_local = (ExeName *)this;
  this_local = __return_storage_ptr__;
  Parser(&local_80,this);
  pPVar1 = operator|=(&local_80,other);
  Parser(__return_storage_ptr__,pPVar1);
  ~Parser(&local_80);
  return __return_storage_ptr__;
}

Assistant:

auto operator|(T const& other) const -> Parser {
                return Parser(*this) |= other;
            }